

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtls.c
# Opt level: O1

_Bool Curl_ssl_getsessionid(connectdata *conn,void **ssl_sessionid,size_t *idsize,int sockindex)

{
  Curl_easy *pCVar1;
  char *first;
  Curl_share *pCVar2;
  curl_ssl_session *pcVar3;
  char *second;
  long lVar4;
  proxy_info *ppVar5;
  _Bool _Var6;
  int iVar7;
  long *plVar8;
  byte bVar9;
  int iVar10;
  long lVar11;
  ulong uVar12;
  bool bVar13;
  bool bVar14;
  
  if ((conn->http_proxy).proxytype == CURLPROXY_HTTPS) {
    bVar9 = (conn->bits).proxy_ssl_connected[sockindex] ^ 1;
  }
  else {
    bVar9 = 0;
  }
  pCVar1 = conn->data;
  ppVar5 = (proxy_info *)&conn->host;
  if (bVar9 == 0) {
    iVar10 = conn->remote_port;
  }
  else {
    iVar10 = (int)conn->port;
    ppVar5 = &conn->http_proxy;
  }
  first = (ppVar5->host).name;
  *ssl_sessionid = (void *)0x0;
  bVar14 = true;
  if ((pCVar1->set).general_ssl.sessionid == true) {
    pCVar2 = pCVar1->share;
    if ((pCVar2 == (Curl_share *)0x0) || ((pCVar2->specifier & 0x10) == 0)) {
      plVar8 = &(pCVar1->state).sessionage;
    }
    else {
      plVar8 = &pCVar2->sessionage;
    }
    bVar14 = (pCVar1->set).general_ssl.max_ssl_sessions == 0;
    if (!bVar14) {
      lVar11 = 0x38;
      uVar12 = 0;
      do {
        pcVar3 = (pCVar1->state).session;
        if ((*(long *)((long)pcVar3 + lVar11 + -0x20) != 0) &&
           (iVar7 = Curl_strcasecompare(first,*(char **)((long)pcVar3 + lVar11 + -0x38)), iVar7 != 0
           )) {
          if ((conn->bits).conn_to_host == false) {
            if (*(long *)((long)pcVar3 + lVar11 + -0x30) == 0) {
LAB_0014561b:
              if ((conn->bits).conn_to_port == false) {
                if (*(int *)((long)pcVar3 + lVar11 + -4) == -1) {
LAB_00145645:
                  if (((iVar10 == *(int *)((long)pcVar3 + lVar11 + -8)) &&
                      (iVar7 = Curl_strcasecompare(conn->handler->scheme,
                                                   *(char **)((long)pcVar3 + lVar11 + -0x28)),
                      iVar7 != 0)) &&
                     (_Var6 = Curl_ssl_config_matches
                                        ((ssl_primary_config *)
                                         ((long)conn->proxy_ssl + (ulong)bVar9 * 0x40 + 0x50),
                                         (ssl_primary_config *)((long)&pcVar3->name + lVar11)),
                     _Var6)) {
                    lVar4 = *plVar8;
                    *plVar8 = lVar4 + 1;
                    *(long *)((long)pcVar3 + lVar11 + -0x10) = lVar4 + 1;
                    *ssl_sessionid = *(void **)((long)pcVar3 + lVar11 + -0x20);
                    if (idsize != (size_t *)0x0) {
                      *idsize = *(size_t *)((long)pcVar3 + lVar11 + -0x18);
                    }
                    return false;
                  }
                }
              }
              else {
                iVar7 = *(int *)((long)pcVar3 + lVar11 + -4);
                if ((iVar7 != -1) && (conn->conn_to_port == iVar7)) goto LAB_00145645;
              }
            }
          }
          else {
            second = *(char **)((long)pcVar3 + lVar11 + -0x30);
            if ((second != (char *)0x0) &&
               (iVar7 = Curl_strcasecompare((conn->conn_to_host).name,second), iVar7 != 0))
            goto LAB_0014561b;
          }
        }
        uVar12 = uVar12 + 1;
        lVar11 = lVar11 + 0x78;
        bVar13 = uVar12 < (pCVar1->set).general_ssl.max_ssl_sessions;
        bVar14 = !bVar13;
      } while (bVar13);
    }
  }
  return bVar14;
}

Assistant:

bool Curl_ssl_getsessionid(struct connectdata *conn,
                           void **ssl_sessionid,
                           size_t *idsize, /* set 0 if unknown */
                           int sockindex)
{
  struct curl_ssl_session *check;
  struct Curl_easy *data = conn->data;
  size_t i;
  long *general_age;
  bool no_match = TRUE;

  const bool isProxy = CONNECT_PROXY_SSL();
  struct ssl_primary_config * const ssl_config = isProxy ?
    &conn->proxy_ssl_config :
    &conn->ssl_config;
  const char * const name = isProxy ? conn->http_proxy.host.name :
    conn->host.name;
  int port = isProxy ? (int)conn->port : conn->remote_port;
  *ssl_sessionid = NULL;

  DEBUGASSERT(data->set.general_ssl.sessionid);

  if(!data->set.general_ssl.sessionid)
    /* session ID re-use is disabled */
    return TRUE;

  /* Lock if shared */
  if(SSLSESSION_SHARED(data))
    general_age = &data->share->sessionage;
  else
    general_age = &data->state.sessionage;

  for(i = 0; i < data->set.general_ssl.max_ssl_sessions; i++) {
    check = &data->state.session[i];
    if(!check->sessionid)
      /* not session ID means blank entry */
      continue;
    if(strcasecompare(name, check->name) &&
       ((!conn->bits.conn_to_host && !check->conn_to_host) ||
        (conn->bits.conn_to_host && check->conn_to_host &&
         strcasecompare(conn->conn_to_host.name, check->conn_to_host))) &&
       ((!conn->bits.conn_to_port && check->conn_to_port == -1) ||
        (conn->bits.conn_to_port && check->conn_to_port != -1 &&
         conn->conn_to_port == check->conn_to_port)) &&
       (port == check->remote_port) &&
       strcasecompare(conn->handler->scheme, check->scheme) &&
       Curl_ssl_config_matches(ssl_config, &check->ssl_config)) {
      /* yes, we have a session ID! */
      (*general_age)++;          /* increase general age */
      check->age = *general_age; /* set this as used in this age */
      *ssl_sessionid = check->sessionid;
      if(idsize)
        *idsize = check->idsize;
      no_match = FALSE;
      break;
    }
  }

  return no_match;
}